

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O0

Vec_Ptr_t * Bbl_ManDfs(Bbl_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  undefined8 local_20;
  Bbl_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Bbl_Man_t *p_local;
  
  vNodes_00 = Vec_PtrAlloc(1000);
  for (local_20 = Bbl_ManObjFirst(p); local_20 != (Bbl_Obj_t *)0x0;
      local_20 = Bbl_ManObjNext(p,local_20)) {
    iVar1 = Bbl_ObjIsLut(local_20);
    if (iVar1 != 0) {
      Bbl_ManDfs_rec(local_20,vNodes_00);
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Bbl_ManDfs( Bbl_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Bbl_Obj_t * pObj;
    vNodes = Vec_PtrAlloc( 1000 );
    Bbl_ManForEachObj( p, pObj )
        if ( Bbl_ObjIsLut(pObj) )
            Bbl_ManDfs_rec( pObj, vNodes );
    return vNodes;
}